

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void nlohmann::detail::dtoa_impl::grisu2_digit_gen
               (char *buffer,int *length,int *decimal_exponent,diyfp M_minus,diyfp w,diyfp M_plus)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t ten_k;
  ulong delta;
  uint64_t dist;
  ulong uVar6;
  diyfp dVar7;
  uint32_t pow10;
  int *local_60;
  uint64_t local_58;
  ulong local_50;
  char *local_48;
  diyfp M_minus_local;
  
  M_minus_local.f = M_minus.f;
  M_minus_local.e = M_minus.e;
  if (M_plus.e < -0x3c) {
    __assert_fail("M_plus.e >= kAlpha",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                  ,0x3a5a,
                  "void nlohmann::detail::dtoa_impl::grisu2_digit_gen(char *, int &, int &, diyfp, diyfp, diyfp)"
                 );
  }
  local_60 = decimal_exponent;
  local_48 = buffer;
  if (-0x20 < M_plus.e) {
    __assert_fail("M_plus.e <= kGamma",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                  ,0x3a5b,
                  "void nlohmann::detail::dtoa_impl::grisu2_digit_gen(char *, int &, int &, diyfp, diyfp, diyfp)"
                 );
  }
  dVar7 = diyfp::sub(&M_plus,&M_minus_local);
  delta = dVar7.f;
  dVar7 = diyfp::sub(&M_plus,&w);
  dist = dVar7.f;
  bVar3 = -(char)M_plus.e;
  local_58 = 1L << (bVar3 & 0x3f);
  uVar4 = M_plus.f >> (bVar3 & 0x3f);
  if ((uint32_t)uVar4 == 0) {
    __assert_fail("p1 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                  ,0x3a70,
                  "void nlohmann::detail::dtoa_impl::grisu2_digit_gen(char *, int &, int &, diyfp, diyfp, diyfp)"
                 );
  }
  local_50 = local_58 - 1;
  uVar6 = M_plus.f & local_50;
  iVar2 = find_largest_pow10((uint32_t)uVar4,&pow10);
  do {
    if (iVar2 < 1) {
      if (uVar6 <= delta) {
        __assert_fail("p2 > delta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                      ,0x3aeb,
                      "void nlohmann::detail::dtoa_impl::grisu2_digit_gen(char *, int &, int &, diyfp, diyfp, diyfp)"
                     );
      }
      iVar2 = 0;
      uVar5 = uVar6;
      do {
        if (0x1999999999999999 < uVar5) {
          __assert_fail("p2 <= (std::numeric_limits<std::uint64_t>::max)() / 10",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                        ,0x3af6,
                        "void nlohmann::detail::dtoa_impl::grisu2_digit_gen(char *, int &, int &, diyfp, diyfp, diyfp)"
                       );
        }
        uVar4 = uVar5 * 10 >> (bVar3 & 0x3f);
        if (9 < uVar4) {
          __assert_fail("d <= 9",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                        ,0x3aff,
                        "void nlohmann::detail::dtoa_impl::grisu2_digit_gen(char *, int &, int &, diyfp, diyfp, diyfp)"
                       );
        }
        uVar5 = uVar5 * 10 & local_50;
        iVar1 = *length;
        *length = iVar1 + 1;
        local_48[iVar1] = (byte)uVar4 | 0x30;
        delta = delta * 10;
        dist = dist * 10;
        iVar2 = iVar2 + -1;
      } while (delta < uVar5);
      *local_60 = *local_60 + iVar2;
      iVar2 = *length;
      ten_k = local_58;
LAB_00125a3f:
      grisu2_round(local_48,iVar2,dist,delta,uVar5,ten_k);
      return;
    }
    uVar5 = (uVar4 & 0xffffffff) / (ulong)pow10;
    uVar4 = (uVar4 & 0xffffffff) % (ulong)pow10;
    if (9 < (uint)uVar5) {
      __assert_fail("d <= 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                    ,0x3a94,
                    "void nlohmann::detail::dtoa_impl::grisu2_digit_gen(char *, int &, int &, diyfp, diyfp, diyfp)"
                   );
    }
    iVar1 = *length;
    *length = iVar1 + 1;
    local_48[iVar1] = (byte)uVar5 | 0x30;
    uVar5 = (uVar4 << (bVar3 & 0x3f)) + uVar6;
    if (uVar5 <= delta) {
      *local_60 = *local_60 + iVar2 + -1;
      iVar2 = *length;
      ten_k = (ulong)pow10 << (bVar3 & 0x3f);
      goto LAB_00125a3f;
    }
    pow10 = pow10 / 10;
    iVar2 = iVar2 + -1;
  } while( true );
}

Assistant:

inline void grisu2_digit_gen(char* buffer, int& length, int& decimal_exponent,
                diyfp M_minus, diyfp w, diyfp M_plus)
            {
                static_assert(kAlpha >= -60, "internal error");
                static_assert(kGamma <= -32, "internal error");

                // Generates the digits (and the exponent) of a decimal floating-point
                // number V = buffer * 10^decimal_exponent in the range [M-, M+]. The diyfp's
                // w, M- and M+ share the same exponent e, which satisfies alpha <= e <= gamma.
                //
                //               <--------------------------- delta ---->
                //                                  <---- dist --------->
                // --------------[------------------+-------------------]--------------
                //               M-                 w                   M+
                //
                // Grisu2 generates the digits of M+ from left to right and stops as soon as
                // V is in [M-,M+].

                JSON_ASSERT(M_plus.e >= kAlpha);
                JSON_ASSERT(M_plus.e <= kGamma);

                std::uint64_t delta = diyfp::sub(M_plus, M_minus).f; // (significand of (M+ - M-), implicit exponent is e)
                std::uint64_t dist = diyfp::sub(M_plus, w).f; // (significand of (M+ - w ), implicit exponent is e)

                // Split M+ = f * 2^e into two parts p1 and p2 (note: e < 0):
                //
                //      M+ = f * 2^e
                //         = ((f div 2^-e) * 2^-e + (f mod 2^-e)) * 2^e
                //         = ((p1        ) * 2^-e + (p2        )) * 2^e
                //         = p1 + p2 * 2^e

                const diyfp one(std::uint64_t{ 1 } << -M_plus.e, M_plus.e);

                auto p1 = static_cast<std::uint32_t>(M_plus.f >> -one.e); // p1 = f div 2^-e (Since -e >= 32, p1 fits into a 32-bit int.)
                std::uint64_t p2 = M_plus.f & (one.f - 1);                    // p2 = f mod 2^-e

                // 1)
                //
                // Generate the digits of the integral part p1 = d[n-1]...d[1]d[0]

                JSON_ASSERT(p1 > 0);

                std::uint32_t pow10;
                const int k = find_largest_pow10(p1, pow10);

                //      10^(k-1) <= p1 < 10^k, pow10 = 10^(k-1)
                //
                //      p1 = (p1 div 10^(k-1)) * 10^(k-1) + (p1 mod 10^(k-1))
                //         = (d[k-1]         ) * 10^(k-1) + (p1 mod 10^(k-1))
                //
                //      M+ = p1                                             + p2 * 2^e
                //         = d[k-1] * 10^(k-1) + (p1 mod 10^(k-1))          + p2 * 2^e
                //         = d[k-1] * 10^(k-1) + ((p1 mod 10^(k-1)) * 2^-e + p2) * 2^e
                //         = d[k-1] * 10^(k-1) + (                         rest) * 2^e
                //
                // Now generate the digits d[n] of p1 from left to right (n = k-1,...,0)
                //
                //      p1 = d[k-1]...d[n] * 10^n + d[n-1]...d[0]
                //
                // but stop as soon as
                //
                //      rest * 2^e = (d[n-1]...d[0] * 2^-e + p2) * 2^e <= delta * 2^e

                int n = k;
                while (n > 0)
                {
                    // Invariants:
                    //      M+ = buffer * 10^n + (p1 + p2 * 2^e)    (buffer = 0 for n = k)
                    //      pow10 = 10^(n-1) <= p1 < 10^n
                    //
                    const std::uint32_t d = p1 / pow10;  // d = p1 div 10^(n-1)
                    const std::uint32_t r = p1 % pow10;  // r = p1 mod 10^(n-1)
                    //
                    //      M+ = buffer * 10^n + (d * 10^(n-1) + r) + p2 * 2^e
                    //         = (buffer * 10 + d) * 10^(n-1) + (r + p2 * 2^e)
                    //
                    JSON_ASSERT(d <= 9);
                    buffer[length++] = static_cast<char>('0' + d); // buffer := buffer * 10 + d
                    //
                    //      M+ = buffer * 10^(n-1) + (r + p2 * 2^e)
                    //
                    p1 = r;
                    n--;
                    //
                    //      M+ = buffer * 10^n + (p1 + p2 * 2^e)
                    //      pow10 = 10^n
                    //

                    // Now check if enough digits have been generated.
                    // Compute
                    //
                    //      p1 + p2 * 2^e = (p1 * 2^-e + p2) * 2^e = rest * 2^e
                    //
                    // Note:
                    // Since rest and delta share the same exponent e, it suffices to
                    // compare the significands.
                    const std::uint64_t rest = (std::uint64_t{ p1 } << -one.e) + p2;
                    if (rest <= delta)
                    {
                        // V = buffer * 10^n, with M- <= V <= M+.

                        decimal_exponent += n;

                        // We may now just stop. But instead look if the buffer could be
                        // decremented to bring V closer to w.
                        //
                        // pow10 = 10^n is now 1 ulp in the decimal representation V.
                        // The rounding procedure works with diyfp's with an implicit
                        // exponent of e.
                        //
                        //      10^n = (10^n * 2^-e) * 2^e = ulp * 2^e
                        //
                        const std::uint64_t ten_n = std::uint64_t{ pow10 } << -one.e;
                        grisu2_round(buffer, length, dist, delta, rest, ten_n);

                        return;
                    }

                    pow10 /= 10;
                    //
                    //      pow10 = 10^(n-1) <= p1 < 10^n
                    // Invariants restored.
                }

                // 2)
                //
                // The digits of the integral part have been generated:
                //
                //      M+ = d[k-1]...d[1]d[0] + p2 * 2^e
                //         = buffer            + p2 * 2^e
                //
                // Now generate the digits of the fractional part p2 * 2^e.
                //
                // Note:
                // No decimal point is generated: the exponent is adjusted instead.
                //
                // p2 actually represents the fraction
                //
                //      p2 * 2^e
                //          = p2 / 2^-e
                //          = d[-1] / 10^1 + d[-2] / 10^2 + ...
                //
                // Now generate the digits d[-m] of p1 from left to right (m = 1,2,...)
                //
                //      p2 * 2^e = d[-1]d[-2]...d[-m] * 10^-m
                //                      + 10^-m * (d[-m-1] / 10^1 + d[-m-2] / 10^2 + ...)
                //
                // using
                //
                //      10^m * p2 = ((10^m * p2) div 2^-e) * 2^-e + ((10^m * p2) mod 2^-e)
                //                = (                   d) * 2^-e + (                   r)
                //
                // or
                //      10^m * p2 * 2^e = d + r * 2^e
                //
                // i.e.
                //
                //      M+ = buffer + p2 * 2^e
                //         = buffer + 10^-m * (d + r * 2^e)
                //         = (buffer * 10^m + d) * 10^-m + 10^-m * r * 2^e
                //
                // and stop as soon as 10^-m * r * 2^e <= delta * 2^e

                JSON_ASSERT(p2 > delta);

                int m = 0;
                for (;;)
                {
                    // Invariant:
                    //      M+ = buffer * 10^-m + 10^-m * (d[-m-1] / 10 + d[-m-2] / 10^2 + ...) * 2^e
                    //         = buffer * 10^-m + 10^-m * (p2                                 ) * 2^e
                    //         = buffer * 10^-m + 10^-m * (1/10 * (10 * p2)                   ) * 2^e
                    //         = buffer * 10^-m + 10^-m * (1/10 * ((10*p2 div 2^-e) * 2^-e + (10*p2 mod 2^-e)) * 2^e
                    //
                    JSON_ASSERT(p2 <= (std::numeric_limits<std::uint64_t>::max)() / 10);
                    p2 *= 10;
                    const std::uint64_t d = p2 >> -one.e;     // d = (10 * p2) div 2^-e
                    const std::uint64_t r = p2 & (one.f - 1); // r = (10 * p2) mod 2^-e
                    //
                    //      M+ = buffer * 10^-m + 10^-m * (1/10 * (d * 2^-e + r) * 2^e
                    //         = buffer * 10^-m + 10^-m * (1/10 * (d + r * 2^e))
                    //         = (buffer * 10 + d) * 10^(-m-1) + 10^(-m-1) * r * 2^e
                    //
                    JSON_ASSERT(d <= 9);
                    buffer[length++] = static_cast<char>('0' + d); // buffer := buffer * 10 + d
                    //
                    //      M+ = buffer * 10^(-m-1) + 10^(-m-1) * r * 2^e
                    //
                    p2 = r;
                    m++;
                    //
                    //      M+ = buffer * 10^-m + 10^-m * p2 * 2^e
                    // Invariant restored.

                    // Check if enough digits have been generated.
                    //
                    //      10^-m * p2 * 2^e <= delta * 2^e
                    //              p2 * 2^e <= 10^m * delta * 2^e
                    //                    p2 <= 10^m * delta
                    delta *= 10;
                    dist *= 10;
                    if (p2 <= delta)
                    {
                        break;
                    }
                }

                // V = buffer * 10^-m, with M- <= V <= M+.

                decimal_exponent -= m;

                // 1 ulp in the decimal representation is now 10^-m.
                // Since delta and dist are now scaled by 10^m, we need to do the
                // same with ulp in order to keep the units in sync.
                //
                //      10^m * 10^-m = 1 = 2^-e * 2^e = ten_m * 2^e
                //
                const std::uint64_t ten_m = one.f;
                grisu2_round(buffer, length, dist, delta, p2, ten_m);

                // By construction this algorithm generates the shortest possible decimal
                // number (Loitsch, Theorem 6.2) which rounds back to w.
                // For an input number of precision p, at least
                //
                //      N = 1 + ceil(p * log_10(2))
                //
                // decimal digits are sufficient to identify all binary floating-point
                // numbers (Matula, "In-and-Out conversions").
                // This implies that the algorithm does not produce more than N decimal
                // digits.
                //
                //      N = 17 for p = 53 (IEEE double precision)
                //      N = 9  for p = 24 (IEEE single precision)
            }